

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void fill_circle(chunk_conflict *c,wchar_t y0,wchar_t x0,wchar_t radius,wchar_t border,wchar_t feat,
                wchar_t flag,_Bool light)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t local_3c;
  wchar_t adj;
  wchar_t b;
  wchar_t r2i2k2;
  wchar_t k;
  wchar_t last;
  wchar_t i;
  _Bool light_local;
  wchar_t feat_local;
  wchar_t border_local;
  wchar_t radius_local;
  wchar_t x0_local;
  wchar_t y0_local;
  chunk_conflict *c_local;
  
  r2i2k2 = L'\0';
  adj = L'\0';
  b = radius;
  for (k = L'\0'; k <= radius; k = k + L'\x01') {
    local_3c = border;
    if ((border != L'\0') && (b < r2i2k2)) {
      local_3c = border + L'\x01';
    }
    fill_xrange(c,y0 - k,(x0 - b) - local_3c,x0 + b + local_3c,feat,flag,light);
    fill_xrange(c,y0 + k,(x0 - b) - local_3c,x0 + b + local_3c,feat,flag,light);
    fill_yrange(c,x0 - k,(y0 - b) - local_3c,y0 + b + local_3c,feat,flag,light);
    fill_yrange(c,x0 + k,(y0 - b) - local_3c,y0 + b + local_3c,feat,flag,light);
    r2i2k2 = b;
    if (k < radius) {
      adj = adj - (k * 2 + 1);
      while( true ) {
        iVar1 = b * 2 + -1;
        wVar2 = adj + iVar1;
        if (wVar2 < L'\x01') {
          wVar2 = -wVar2;
        }
        wVar3 = adj;
        if (adj < L'\x01') {
          wVar3 = -adj;
        }
        if (wVar3 <= wVar2) break;
        b = b + L'\xffffffff';
        adj = iVar1 + adj;
      }
    }
  }
  return;
}

Assistant:

void fill_circle(struct chunk *c, int y0, int x0, int radius, int border,
				 int feat, int flag, bool light)
{
	int i, last = 0;
	/* r2i2k2 is radius * radius - i * i - k * k. */
	int k, r2i2k2;
	for(i = 0, k = radius, r2i2k2 = 0; i <= radius; i++) {
		int b = border;
		if (border && last > k) b++;
		
		fill_xrange(c, y0 - i, x0 - k - b, x0 + k + b, feat, flag, light);
		fill_xrange(c, y0 + i, x0 - k - b, x0 + k + b, feat, flag, light);
		fill_yrange(c, x0 - i, y0 - k - b, y0 + k + b, feat, flag, light);
		fill_yrange(c, x0 + i, y0 - k - b, y0 + k + b, feat, flag, light);
		last = k;

		/* Update r2i2k2 and k for next i. */
		if (i < radius) {
			r2i2k2 -= 2 * i + 1;
			while (1) {
				/*
				 * The change to r2i2k2 if k is decreased by
				 * one.
				 */
				int adj = 2 * k - 1;

				if (abs(r2i2k2 + adj) >= abs(r2i2k2)) {
					break;
				}
				--k;
				r2i2k2 += adj;
			}
		}
	}
}